

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O2

void initialize(econf_file *key_file,size_t num)

{
  file_entry *pfVar1;
  char *pcVar2;
  
  pcVar2 = setGroupList(key_file,"_none_");
  pfVar1 = key_file->file_entry;
  pfVar1[num].group = pcVar2;
  pcVar2 = strdup("_none_");
  pfVar1[num].key = pcVar2;
  pcVar2 = strdup("_none_");
  pfVar1[num].value = pcVar2;
  pfVar1[num].quotes = false;
  pfVar1[num].comment_before_key = (char *)0x0;
  (&pfVar1[num].comment_before_key)[1] = (char *)0x0;
  return;
}

Assistant:

void initialize(econf_file *key_file, size_t num) {
  key_file->file_entry[num].group = setGroupList(key_file, KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].key = strdup(KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].value = strdup(KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].comment_before_key = NULL;
  key_file->file_entry[num].comment_after_value = NULL;
  key_file->file_entry[num].quotes = false;
}